

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O0

void __thiscall XipFile::FileEntry::~FileEntry(FileEntry *this)

{
  FileEntry *this_local;
  
  ~FileEntry(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

FileEntry(uint64_t pos, const uint8_t *pdata)
            : XipEntry(pos)
        {
            _attr= get32le(pdata);
            _filetime= get64le(pdata+0x4);
            _size= get32le(pdata+0xC);
            _compsize= get32le(pdata+0x10);
            _rvaname= get32le(pdata+0x14);
            _rvaload= get32le(pdata+0x18);
        }